

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O1

void coda_base58_encode(char *in,size_t inlen,char *out,size_t outlen)

{
  size_t sVar1;
  size_t sVar2;
  char *__ptr;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  ulong __nmemb;
  bool bVar13;
  bool bVar14;
  
  if (inlen != 0 && outlen != 0) {
    sVar1 = 1;
    sVar4 = inlen;
    sVar11 = outlen;
    do {
      sVar2 = sVar1;
      if (in[sVar2 - 1] != '\0') {
        out = out + (sVar2 - 1);
        in = in + (sVar2 - 1);
        inlen = sVar4;
        outlen = sVar11;
        goto LAB_001016be;
      }
      out[sVar2 - 1] = '1';
      sVar11 = sVar11 - 1;
      sVar4 = sVar4 - 1;
    } while ((outlen != sVar2) && (sVar1 = sVar2 + 1, inlen != sVar2));
    out = out + sVar2;
    in = in + sVar2;
    inlen = sVar4;
    outlen = sVar11;
  }
LAB_001016be:
  uVar10 = (inlen * 0x8a) / 100;
  iVar12 = (int)uVar10;
  __nmemb = (ulong)(iVar12 + 1U);
  __ptr = (char *)calloc(__nmemb,1);
  if (inlen != 0) {
    do {
      uVar5 = (uint)(byte)*in;
      lVar7 = (long)iVar12;
      if ((*in != 0) || (-1 < iVar12)) {
        do {
          do {
            lVar8 = lVar7;
            uVar9 = __ptr[lVar8] * 0x100 + uVar5;
            uVar5 = uVar9 / 0x3a;
            __ptr[lVar8] = (char)uVar9 + (char)(uVar9 / 0x3a) * -0x3a;
            lVar7 = lVar8 + -1;
          } while (0x39 < uVar9);
        } while (0 < lVar8);
      }
      in = (char *)((byte *)in + 1);
      inlen = inlen - 1;
    } while (inlen != 0);
  }
  pcVar3 = __ptr;
  if (iVar12 + 1U == 0) {
    iVar12 = 0;
  }
  else {
    do {
      iVar12 = (int)__nmemb;
      if (*pcVar3 != '\0') goto LAB_00101776;
      pcVar3 = pcVar3 + 1;
      __nmemb = (ulong)(iVar12 - 1U);
    } while (iVar12 - 1U != 0);
    iVar12 = 0;
    pcVar3 = __ptr + (uVar10 & 0xffffffff) + 1;
  }
LAB_00101776:
  bVar13 = outlen != 0;
  if ((bVar13) && (iVar12 != 0)) {
    lVar7 = 0;
    do {
      out[lVar7] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[(byte)pcVar3[lVar7]]
      ;
      lVar8 = lVar7 + 1;
      bVar14 = outlen - 1 == lVar7;
      bVar13 = !bVar14;
      if (bVar14) break;
      iVar6 = (int)lVar7;
      lVar7 = lVar8;
    } while (iVar12 + -1 != iVar6);
    out = out + lVar8;
  }
  if (bVar13) {
    *out = '\0';
  }
  free(__ptr);
  return;
}

Assistant:

void coda_base58_encode (const char* in, size_t inlen, char* out, size_t outlen)
{
    static const char b58str[58] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz";

    while (outlen && inlen && !*in)
    {
        *out++ = '1';
        outlen--;

        in++;
        inlen--;
    }

    unsigned b58len = inlen * 138 / 100 + 1; // log(256) / log(58), rounded up.
    char* b58_begin = NULL;
    char* b58_curr = NULL;
    b58_begin = b58_curr = (char*)calloc(b58len, sizeof(unsigned char));

    while (inlen)
    {
        unsigned int carry = (unsigned char)*in++;
        int i;
        for (i = b58len - 1; carry || i >= 0; i--)
        {
            carry += 256 * b58_curr[i];
            b58_curr[i] = carry % 58;
            carry /= 58;
        }
        inlen--;
    }

    // Skip leading zeroes in base58 result.
    while (b58len && !*b58_curr)
    {
        b58_curr++;
        b58len--;
    }

    while (outlen && b58len)
    {
        *out++ = b58str[(unsigned char)*b58_curr++];
        b58len--;
        outlen--;
    }

    if (outlen) *out = '\0';

    free(b58_begin);
}